

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking32.h
# Opt level: O3

void unpackforblock24(uint32_t base,uint8_t **pw,uint32_t **pout)

{
  uint8_t *puVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  undefined8 uVar11;
  long lVar12;
  long lVar13;
  uint32_t *puVar14;
  
  puVar1 = *pw;
  uVar2 = *(undefined8 *)puVar1;
  lVar3 = *(long *)(puVar1 + 8);
  lVar4 = *(long *)(puVar1 + 0x10);
  uVar5 = *(undefined8 *)(puVar1 + 0x18);
  lVar6 = *(long *)(puVar1 + 0x20);
  lVar7 = *(long *)(puVar1 + 0x28);
  uVar8 = *(undefined8 *)(puVar1 + 0x30);
  lVar9 = *(long *)(puVar1 + 0x38);
  lVar10 = *(long *)(puVar1 + 0x40);
  uVar11 = *(undefined8 *)(puVar1 + 0x48);
  lVar12 = *(long *)(puVar1 + 0x50);
  lVar13 = *(long *)(puVar1 + 0x58);
  puVar14 = *pout;
  *pw = puVar1 + 0x60;
  *puVar14 = ((uint)uVar2 & 0xffffff) + base;
  puVar14[1] = ((uint)((ulong)uVar2 >> 0x18) & 0xffffff) + base;
  puVar14[2] = ((uint)(lVar3 << 0x10) & 0xffffff | (uint)(ushort)((ulong)uVar2 >> 0x30)) + base;
  puVar14[3] = ((uint)((ulong)lVar3 >> 8) & 0xffffff) + base;
  puVar14[4] = ((uint)((ulong)lVar3 >> 0x20) & 0xffffff) + base;
  puVar14[5] = ((uint)(lVar4 << 8) & 0xffffff | (uint)(byte)((ulong)lVar3 >> 0x38)) + base;
  puVar14[6] = ((uint)((ulong)lVar4 >> 0x10) & 0xffffff) + base;
  puVar14[7] = (uint)((ulong)lVar4 >> 0x28) + base;
  puVar14[8] = ((uint)uVar5 & 0xffffff) + base;
  puVar14[9] = ((uint)((ulong)uVar5 >> 0x18) & 0xffffff) + base;
  puVar14[10] = ((uint)(lVar6 << 0x10) & 0xffffff | (uint)(ushort)((ulong)uVar5 >> 0x30)) + base;
  puVar14[0xb] = ((uint)((ulong)lVar6 >> 8) & 0xffffff) + base;
  puVar14[0xc] = ((uint)((ulong)lVar6 >> 0x20) & 0xffffff) + base;
  puVar14[0xd] = ((uint)(lVar7 << 8) & 0xffffff | (uint)(byte)((ulong)lVar6 >> 0x38)) + base;
  puVar14[0xe] = ((uint)((ulong)lVar7 >> 0x10) & 0xffffff) + base;
  puVar14[0xf] = (uint)((ulong)lVar7 >> 0x28) + base;
  puVar14[0x10] = ((uint)uVar8 & 0xffffff) + base;
  puVar14[0x11] = ((uint)((ulong)uVar8 >> 0x18) & 0xffffff) + base;
  puVar14[0x12] = ((uint)(lVar9 << 0x10) & 0xffffff | (uint)(ushort)((ulong)uVar8 >> 0x30)) + base;
  puVar14[0x13] = ((uint)((ulong)lVar9 >> 8) & 0xffffff) + base;
  puVar14[0x14] = ((uint)((ulong)lVar9 >> 0x20) & 0xffffff) + base;
  puVar14[0x15] = ((uint)(lVar10 << 8) & 0xffffff | (uint)(byte)((ulong)lVar9 >> 0x38)) + base;
  puVar14[0x16] = ((uint)((ulong)lVar10 >> 0x10) & 0xffffff) + base;
  puVar14[0x17] = (uint)((ulong)lVar10 >> 0x28) + base;
  puVar14[0x18] = ((uint)uVar11 & 0xffffff) + base;
  puVar14[0x19] = ((uint)((ulong)uVar11 >> 0x18) & 0xffffff) + base;
  puVar14[0x1a] = ((uint)(lVar12 << 0x10) & 0xffffff | (uint)(ushort)((ulong)uVar11 >> 0x30)) + base
  ;
  puVar14[0x1b] = ((uint)((ulong)lVar12 >> 8) & 0xffffff) + base;
  puVar14[0x1c] = ((uint)((ulong)lVar12 >> 0x20) & 0xffffff) + base;
  puVar14[0x1d] = ((uint)(lVar13 << 8) & 0xffffff | (uint)(byte)((ulong)lVar12 >> 0x38)) + base;
  puVar14[0x1e] = ((uint)((ulong)lVar13 >> 0x10) & 0xffffff) + base;
  puVar14[0x1f] = (uint)((ulong)lVar13 >> 0x28) + base;
  *pout = *pout + 0x20;
  return;
}

Assistant:

static void unpackforblock24(const uint32_t base, const uint8_t **pw,
                             uint32_t **pout) {
  const uint64_t *pw64 = *(const uint64_t **)pw;
  uint32_t *out = *pout;
  const uint64_t mask = UINT64_C(16777215);
  /* we are going to access  12 64-bit words */
  uint64_t w0 = pw64[0];
  uint64_t w1 = pw64[1];
  uint64_t w2 = pw64[2];
  uint64_t w3 = pw64[3];
  uint64_t w4 = pw64[4];
  uint64_t w5 = pw64[5];
  uint64_t w6 = pw64[6];
  uint64_t w7 = pw64[7];
  uint64_t w8 = pw64[8];
  uint64_t w9 = pw64[9];
  uint64_t w10 = pw64[10];
  uint64_t w11 = pw64[11];
  *pw += 96; /* we used up 96 input bytes */
  out[0] = base + (uint32_t)((w0)&mask);
  out[1] = base + (uint32_t)((w0 >> 24) & mask);
  out[2] = base + (uint32_t)(((w0 >> 48) | (w1 << 16)) & mask);
  out[3] = base + (uint32_t)((w1 >> 8) & mask);
  out[4] = base + (uint32_t)((w1 >> 32) & mask);
  out[5] = base + (uint32_t)(((w1 >> 56) | (w2 << 8)) & mask);
  out[6] = base + (uint32_t)((w2 >> 16) & mask);
  out[7] = base + (uint32_t)(w2 >> 40);
  out[8] = base + (uint32_t)((w3)&mask);
  out[9] = base + (uint32_t)((w3 >> 24) & mask);
  out[10] = base + (uint32_t)(((w3 >> 48) | (w4 << 16)) & mask);
  out[11] = base + (uint32_t)((w4 >> 8) & mask);
  out[12] = base + (uint32_t)((w4 >> 32) & mask);
  out[13] = base + (uint32_t)(((w4 >> 56) | (w5 << 8)) & mask);
  out[14] = base + (uint32_t)((w5 >> 16) & mask);
  out[15] = base + (uint32_t)(w5 >> 40);
  out[16] = base + (uint32_t)((w6)&mask);
  out[17] = base + (uint32_t)((w6 >> 24) & mask);
  out[18] = base + (uint32_t)(((w6 >> 48) | (w7 << 16)) & mask);
  out[19] = base + (uint32_t)((w7 >> 8) & mask);
  out[20] = base + (uint32_t)((w7 >> 32) & mask);
  out[21] = base + (uint32_t)(((w7 >> 56) | (w8 << 8)) & mask);
  out[22] = base + (uint32_t)((w8 >> 16) & mask);
  out[23] = base + (uint32_t)(w8 >> 40);
  out[24] = base + (uint32_t)((w9)&mask);
  out[25] = base + (uint32_t)((w9 >> 24) & mask);
  out[26] = base + (uint32_t)(((w9 >> 48) | (w10 << 16)) & mask);
  out[27] = base + (uint32_t)((w10 >> 8) & mask);
  out[28] = base + (uint32_t)((w10 >> 32) & mask);
  out[29] = base + (uint32_t)(((w10 >> 56) | (w11 << 8)) & mask);
  out[30] = base + (uint32_t)((w11 >> 16) & mask);
  out[31] = base + (uint32_t)(w11 >> 40);
  *pout += 32; /* we wrote 32 32-bit integers */
}